

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O1

void __thiscall FileBuffer::FileBuffer(FileBuffer *this,char *file,int size,int segments)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int *__s;
  FileBuffer *this_00;
  undefined8 uVar4;
  ulong uVar5;
  FileBuffer *this_01;
  void *unaff_R14;
  
  this->_vptr_FileBuffer = (_func_int **)&PTR__FileBuffer_00104da8;
  this->_bufferSize = 0;
  this->_segments = 0;
  this->_fileLength = 0;
  this->_fileSegmentLength = 0;
  this->_fileCurrentPos = 0;
  if (0 < segments) {
    this->_bufferSize = size;
    this->_file = file;
    this->_segments = segments;
    iVar1 = -1;
    if (-1 < size) {
      iVar1 = size;
    }
    pcVar2 = (char *)operator_new__((long)iVar1);
    this->_buffer = pcVar2;
    if (0 < this->_bufferSize) {
      lVar3 = 0;
      do {
        this->_buffer[lVar3] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->_bufferSize);
    }
    __s = (int *)operator_new__((ulong)(uint)segments << 2);
    this->_loadedSegments = __s;
    uVar5 = 1;
    if (1 < segments) {
      uVar5 = (ulong)(uint)segments;
    }
    memset(__s,0xff,uVar5 << 2);
    this_00 = (FileBuffer *)operator_new(0x208);
    std::ifstream::ifstream((ifstream *)this_00);
    this_01 = this_00;
    std::ifstream::open((char *)this_00,(_Ios_Openmode)this->_file);
    iVar1 = getFileLength(this_01,(ifstream *)this_00);
    this->_fileLength = iVar1;
    std::ifstream::close();
    this->_fileSegmentLength = this->_bufferSize / this->_segments;
    return;
  }
  printf("A buffer can\'t have less than 1 segment. Given segments: %d\n",(ulong)(uint)segments);
  uVar4 = __cxa_rethrow();
  operator_delete(unaff_R14);
  _Unwind_Resume(uVar4);
}

Assistant:

FileBuffer::FileBuffer(char *file, int size, int segments) {
    if (segments < 1) {
        printf("A buffer can't have less than 1 segment. Given segments: %d\n", segments);
        throw;
    }

    _bufferSize = size;
    _file = file;
    _segments = segments;

    _buffer = new char[size];
    for (int i = 0; i < _bufferSize; i++) {
        _buffer[i] = '\0';
    }

    _loadedSegments = new int[segments];
    for (int i = 0; i < segments; i++) {
        _loadedSegments[i] = -1;
    }

    //open the file to get file length, then close it again
    ifstream *fileStream = new ifstream();
    fileStream->open(_file);
    _fileLength = getFileLength(fileStream);
    fileStream->close();

    _fileSegmentLength = _bufferSize / _segments;
}